

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O2

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item,QPlatformMenu *menu)

{
  undefined1 uVar1;
  QDBusPlatformMenu *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivate::qobject_cast_helper<QDBusPlatformMenu_const*,QObject>(&menu->super_QObject);
  local_40.d = (pQVar2->m_text).d.d;
  local_40.ptr = (pQVar2->m_text).d.ptr;
  local_40.size = (pQVar2->m_text).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x70))(item,&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QIcon::QIcon((QIcon *)&local_40,&pQVar2->m_icon);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x78))(item,&local_40);
  QIcon::~QIcon((QIcon *)&local_40);
  uVar1 = (**(code **)(*(long *)&pQVar2->super_QPlatformMenu + 0xa8))(pQVar2);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0xc0))(item,uVar1);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x88))(item,pQVar2->m_isVisible);
  (**(code **)(*(long *)&item->super_QPlatformMenuItem + 0x80))(item,menu);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item, QPlatformMenu *menu)
{
    const QDBusPlatformMenu *ourMenu = qobject_cast<const QDBusPlatformMenu *>(menu);
    item->setText(ourMenu->text());
    item->setIcon(ourMenu->icon());
    item->setEnabled(ourMenu->isEnabled());
    item->setVisible(ourMenu->isVisible());
    item->setMenu(menu);
}